

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O3

void __thiscall
cimod::BinaryPolynomialModel<int,_double>::BinaryPolynomialModel
          (BinaryPolynomialModel<int,_double> *this,Polynomial<int,_double> *poly_map,
          Vartype vartype)

{
  runtime_error *this_00;
  _Hash_node_base *p_Var1;
  
  (this->variables_)._M_h._M_buckets = &(this->variables_)._M_h._M_single_bucket;
  (this->variables_)._M_h._M_bucket_count = 1;
  (this->variables_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->variables_)._M_h._M_element_count = 0;
  (this->variables_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->variables_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->variables_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->each_variable_num_)._M_h._M_buckets = &(this->each_variable_num_)._M_h._M_single_bucket;
  (this->each_variable_num_)._M_h._M_bucket_count = 1;
  (this->each_variable_num_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->each_variable_num_)._M_h._M_element_count = 0;
  (this->each_variable_num_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->each_variable_num_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->each_variable_num_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->variables_to_integers_)._M_h._M_buckets =
       &(this->variables_to_integers_)._M_h._M_single_bucket;
  (this->variables_to_integers_)._M_h._M_bucket_count = 1;
  (this->variables_to_integers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->variables_to_integers_)._M_h._M_element_count = 0;
  (this->variables_to_integers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->variables_to_integers_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->variables_to_integers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sorted_variables_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sorted_variables_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sorted_variables_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->relabel_flag_for_variables_to_integers_ = true;
  (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->poly_key_list_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->poly_key_list_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->poly_key_list_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->poly_key_inv_)._M_h._M_buckets = &(this->poly_key_inv_)._M_h._M_single_bucket;
  (this->poly_key_inv_)._M_h._M_bucket_count = 1;
  (this->poly_key_inv_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->poly_key_inv_)._M_h._M_element_count = 0;
  (this->poly_key_inv_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->poly_key_inv_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->poly_key_inv_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->vartype_ = vartype;
  if (vartype != NONE) {
    for (p_Var1 = (poly_map->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
        p_Var1 = p_Var1->_M_nxt) {
      AddInteraction(this,(vector<int,_std::allocator<int>_> *)(p_Var1 + 1),(double *)(p_Var1 + 4),
                     NONE);
    }
    UpdateVariablesToIntegers(this);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unknown vartype detected");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

BinaryPolynomialModel( const Polynomial<IndexType, FloatType> &poly_map, const Vartype vartype ) : vartype_( vartype ) {
      if ( vartype_ == Vartype::NONE ) {
        throw std::runtime_error( "Unknown vartype detected" );
      }
      AddInteractionsFrom( poly_map );
      UpdateVariablesToIntegers();
    }